

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FiniteModelMultiSorted.hpp
# Opt level: O0

string * __thiscall
FMB::FiniteModelMultiSorted::prepend(FiniteModelMultiSorted *this,char *prefix,string *name)

{
  ulong uVar1;
  char *pcVar2;
  ulong in_RCX;
  string *in_RDI;
  string dequoted;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  char *in_stack_fffffffffffffef8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff00;
  char *in_stack_ffffffffffffff08;
  string local_e0 [32];
  string local_c0 [39];
  undefined1 local_99 [33];
  string local_78 [32];
  string local_58 [55];
  allocator<char> local_21 [33];
  
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    pcVar2 = (char *)std::__cxx11::string::operator[](in_RCX);
    if (*pcVar2 == '$') {
      pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_99;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(allocator<char> *)in_RDI);
      std::operator+(pbVar3,(char *)in_stack_fffffffffffffec0);
      std::operator+(pbVar3,in_stack_fffffffffffffec0);
      std::operator+(pbVar3,(char *)in_stack_fffffffffffffec0);
      std::__cxx11::string::~string(local_58);
      std::__cxx11::string::~string(local_78);
      std::__cxx11::string::~string((string *)(local_99 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_99);
    }
    else {
      pcVar2 = (char *)std::__cxx11::string::operator[](in_RCX);
      if (*pcVar2 == '\'') {
        std::__cxx11::string::length();
        std::__cxx11::string::substr((ulong)local_c0,in_RCX);
        pbVar3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &stack0xfffffffffffffeff;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(allocator<char> *)in_RDI);
        std::operator+(in_stack_fffffffffffffec8,(char *)pbVar3);
        std::operator+(in_stack_fffffffffffffec8,pbVar3);
        std::__cxx11::string::~string(local_e0);
        std::__cxx11::string::~string((string *)&stack0xffffffffffffff00);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeff);
        std::__cxx11::string::~string(local_c0);
      }
      else {
        std::operator+(in_stack_ffffffffffffff08,in_stack_ffffffffffffff00);
      }
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffff00,in_stack_fffffffffffffef8,(allocator<char> *)in_RDI);
    std::allocator<char>::~allocator(local_21);
  }
  return in_RDI;
}

Assistant:

std::string prepend(const char* prefix, std::string name) {
    if (name.empty()) {
      return std::string(prefix);
    } else if(name[0] == '$') {
      return std::string("'") + prefix + name + "'";
    } else if (name[0] == '\'') {
      std::string dequoted = name.substr(1, name.length() - 1);
      return std::string("'") + prefix + dequoted;
    } else {
      return prefix + name;
    }
  }